

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  element_type *peVar2;
  long lVar3;
  CompilerFeatures *features;
  allocator<char> local_39;
  string local_38;
  cmQtAutoGenInitializer *local_18;
  cmQtAutoGenInitializer *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rcc",&local_39);
  bVar1 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    peVar2 = std::
             __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->Rcc).super_GenVarsT.ExecutableFeatures);
    if ((peVar2->Evaluated & 1U) == 0) {
      if (((this->QtVersion).Major == 5) || ((this->QtVersion).Major == 6)) {
        lVar3 = std::__cxx11::string::find((char *)&peVar2->HelpOutput,0x931787);
        if (lVar3 == -1) {
          lVar3 = std::__cxx11::string::find((char *)&peVar2->HelpOutput,0x931788);
          if (lVar3 != -1) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[6]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &peVar2->ListOptions,(char (*) [6])0x931788);
          }
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[7]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &peVar2->ListOptions,(char (*) [7])"--list");
        }
      }
      peVar2->Evaluated = true;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    if (!this->GetQtExecutable(this->Rcc, "rcc", false)) {
      return false;
    }
    // Evaluate test output on demand
    CompilerFeatures& features = *this->Rcc.ExecutableFeatures;
    if (!features.Evaluated) {
      // Look for list options
      if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
        if (features.HelpOutput.find("--list") != std::string::npos) {
          features.ListOptions.emplace_back("--list");
        } else if (features.HelpOutput.find("-list") != std::string::npos) {
          features.ListOptions.emplace_back("-list");
        }
      }
      // Evaluation finished
      features.Evaluated = true;
    }
  }

  return true;
}